

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_common.c
# Opt level: O2

uint64_t lzma_delta_coder_memusage(void *options)

{
  if ((options != (void *)0x0) && (*options == 0)) {
    return -(ulong)(*(int *)((long)options + 4) - 0x101U < 0xffffff00) | 0x150;
  }
  return 0xffffffffffffffff;
}

Assistant:

extern uint64_t
lzma_delta_coder_memusage(const void *options)
{
	const lzma_options_delta *opt = options;

	if (opt == NULL || opt->type != LZMA_DELTA_TYPE_BYTE
			|| opt->dist < LZMA_DELTA_DIST_MIN
			|| opt->dist > LZMA_DELTA_DIST_MAX)
		return UINT64_MAX;

	return sizeof(lzma_coder);
}